

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.cpp
# Opt level: O3

void __thiscall
AutoFile::AutoFile(AutoFile *this,FILE *file,vector<std::byte,_std::allocator<std::byte>_> data_xor)

{
  long lVar1;
  pointer pbVar2;
  long lVar3;
  undefined8 *in_RDX;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this->m_file = file;
  pbVar2 = (pointer)in_RDX[1];
  (this->m_xor).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)*in_RDX;
  (this->m_xor).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = pbVar2;
  (this->m_xor).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)in_RDX[2];
  *in_RDX = 0;
  in_RDX[1] = 0;
  in_RDX[2] = 0;
  (this->m_position).super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_engaged = false;
  if ((FILE *)this->m_file != (FILE *)0x0) {
    lVar3 = ftell((FILE *)this->m_file);
    if (-1 < lVar3) {
      (this->m_position).super__Optional_base<long,_true,_true>._M_payload.
      super__Optional_payload_base<long>._M_payload._M_value = lVar3;
      (this->m_position).super__Optional_base<long,_true,_true>._M_payload.
      super__Optional_payload_base<long>._M_engaged = true;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

AutoFile::AutoFile(std::FILE* file, std::vector<std::byte> data_xor)
    : m_file{file}, m_xor{std::move(data_xor)}
{
    if (!IsNull()) {
        auto pos{std::ftell(m_file)};
        if (pos >= 0) m_position = pos;
    }
}